

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scope.cpp
# Opt level: O1

NetType * __thiscall slang::ast::Scope::getDefaultNetType(Scope *this)

{
  Symbol *pSVar1;
  bool bVar2;
  NetType *in_RAX;
  NetType *pNVar3;
  Scope *pSVar4;
  Scope *current;
  
  pSVar4 = this;
  do {
    pSVar1 = pSVar4->thisSym;
    if (pSVar1->kind == InstanceBody) {
      in_RAX = *(NetType **)(pSVar1[2].name._M_str + 0x40);
LAB_003bd558:
      bVar2 = false;
    }
    else {
      if (pSVar1->kind == Package) {
        in_RAX = (NetType *)pSVar1[1].originatingSyntax;
        goto LAB_003bd558;
      }
      pSVar4 = pSVar1->parentScope;
      bVar2 = true;
    }
    if (!bVar2) {
      return in_RAX;
    }
    if (pSVar4 == (Scope *)0x0) {
      pNVar3 = Compilation::getNetType(this->compilation,Unknown);
      return pNVar3;
    }
  } while( true );
}

Assistant:

const NetType& Scope::getDefaultNetType() const {
    const Scope* current = this;
    do {
        auto& sym = current->asSymbol();
        switch (sym.kind) {
            case SymbolKind::Package:
                return sym.as<PackageSymbol>().defaultNetType;
            default:
                if (sym.kind == SymbolKind::InstanceBody)
                    return sym.as<InstanceBodySymbol>().getDefinition().defaultNetType;
                else
                    current = sym.getParentScope();
                break;
        }
    } while (current);

    return getCompilation().getNetType(TokenKind::Unknown);
}